

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

void __thiscall
gvr::anon_unknown_3::PLYProperty::PLYProperty
          (PLYProperty *this,string *propname,ply_type t_size,ply_type t_value,ply_encoding encoding
          )

{
  PLYValueList *this_00;
  
  this->enc = encoding;
  std::__cxx11::string::string((string *)&this->name,(string *)propname);
  this->tsize = t_size;
  this->tvalue = t_value;
  this_00 = (PLYValueList *)operator_new(0x40);
  PLYValueList::PLYValueList(this_00,t_size,t_value,encoding);
  this->value = (PLYValue *)this_00;
  this->receiver = (PLYReceiver *)0x0;
  return;
}

Assistant:

PLYProperty::PLYProperty(const std::string &propname, ply_type t_size, ply_type t_value,
                         ply_encoding encoding): enc(encoding), name(propname)
{
  tsize=t_size;
  tvalue=t_value;
  value=new PLYValueList(tsize, tvalue, encoding);
  receiver=0;
}